

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_mtree.c
# Opt level: O0

void sum_init(mtree_writer *mtree)

{
  int iVar1;
  mtree_writer *mtree_local;
  
  mtree->compute_sum = 0;
  if ((mtree->keys & 1U) != 0) {
    mtree->compute_sum = mtree->compute_sum | 1;
    mtree->crc = 0;
    mtree->crc_len = 0;
  }
  if ((mtree->keys & 0x100U) != 0) {
    iVar1 = __archive_openssl_md5init(&mtree->md5ctx);
    if (iVar1 == 0) {
      mtree->compute_sum = mtree->compute_sum | 0x100;
    }
    else {
      mtree->keys = mtree->keys & 0xfffffeff;
    }
  }
  if ((mtree->keys & 0x2000U) != 0) {
    iVar1 = __archive_openssl_ripemd160init(&mtree->rmd160ctx);
    if (iVar1 == 0) {
      mtree->compute_sum = mtree->compute_sum | 0x2000;
    }
    else {
      mtree->keys = mtree->keys & 0xffffdfff;
    }
  }
  if ((mtree->keys & 0x4000U) != 0) {
    iVar1 = __archive_openssl_sha1init(&mtree->sha1ctx);
    if (iVar1 == 0) {
      mtree->compute_sum = mtree->compute_sum | 0x4000;
    }
    else {
      mtree->keys = mtree->keys & 0xffffbfff;
    }
  }
  if ((mtree->keys & 0x800000U) != 0) {
    iVar1 = __archive_openssl_sha256init(&mtree->sha256ctx);
    if (iVar1 == 0) {
      mtree->compute_sum = mtree->compute_sum | 0x800000;
    }
    else {
      mtree->keys = mtree->keys & 0xff7fffff;
    }
  }
  if ((mtree->keys & 0x1000000U) != 0) {
    iVar1 = __archive_openssl_sha384init(&mtree->sha384ctx);
    if (iVar1 == 0) {
      mtree->compute_sum = mtree->compute_sum | 0x1000000;
    }
    else {
      mtree->keys = mtree->keys & 0xfeffffff;
    }
  }
  if ((mtree->keys & 0x2000000U) != 0) {
    iVar1 = __archive_openssl_sha512init(&mtree->sha512ctx);
    if (iVar1 == 0) {
      mtree->compute_sum = mtree->compute_sum | 0x2000000;
    }
    else {
      mtree->keys = mtree->keys & 0xfdffffff;
    }
  }
  return;
}

Assistant:

static void
sum_init(struct mtree_writer *mtree)
{

	mtree->compute_sum = 0;

	if (mtree->keys & F_CKSUM) {
		mtree->compute_sum |= F_CKSUM;
		mtree->crc = 0;
		mtree->crc_len = 0;
	}
#ifdef ARCHIVE_HAS_MD5
	if (mtree->keys & F_MD5) {
		if (archive_md5_init(&mtree->md5ctx) == ARCHIVE_OK)
			mtree->compute_sum |= F_MD5;
		else
			mtree->keys &= ~F_MD5;/* Not supported. */
	}
#endif
#ifdef ARCHIVE_HAS_RMD160
	if (mtree->keys & F_RMD160) {
		if (archive_rmd160_init(&mtree->rmd160ctx) == ARCHIVE_OK)
			mtree->compute_sum |= F_RMD160;
		else
			mtree->keys &= ~F_RMD160;/* Not supported. */
	}
#endif
#ifdef ARCHIVE_HAS_SHA1
	if (mtree->keys & F_SHA1) {
		if (archive_sha1_init(&mtree->sha1ctx) == ARCHIVE_OK)
			mtree->compute_sum |= F_SHA1;
		else
			mtree->keys &= ~F_SHA1;/* Not supported. */
	}
#endif
#ifdef ARCHIVE_HAS_SHA256
	if (mtree->keys & F_SHA256) {
		if (archive_sha256_init(&mtree->sha256ctx) == ARCHIVE_OK)
			mtree->compute_sum |= F_SHA256;
		else
			mtree->keys &= ~F_SHA256;/* Not supported. */
	}
#endif
#ifdef ARCHIVE_HAS_SHA384
	if (mtree->keys & F_SHA384) {
		if (archive_sha384_init(&mtree->sha384ctx) == ARCHIVE_OK)
			mtree->compute_sum |= F_SHA384;
		else
			mtree->keys &= ~F_SHA384;/* Not supported. */
	}
#endif
#ifdef ARCHIVE_HAS_SHA512
	if (mtree->keys & F_SHA512) {
		if (archive_sha512_init(&mtree->sha512ctx) == ARCHIVE_OK)
			mtree->compute_sum |= F_SHA512;
		else
			mtree->keys &= ~F_SHA512;/* Not supported. */
	}
#endif
}